

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope.cxx
# Opt level: O0

void __thiscall xray_re::xr_envelope::insert_key(xr_envelope *this,float time,float value)

{
  bool bVar1;
  size_type sVar2;
  reference ppxVar3;
  reference ppxVar4;
  __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
  *this_00;
  xr_key *this_01;
  const_iterator local_a0;
  xr_key *local_88;
  xr_key *key;
  xr_key *key0;
  xr_key *key1;
  xr_key **local_68;
  xr_key **local_60;
  xr_key **local_58;
  value_type local_50;
  xr_key *ekey;
  xr_key *skey;
  xr_key **local_38;
  value_type local_30;
  xr_key *key_1;
  __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
  local_20;
  xr_key_vec_it it;
  float value_local;
  float time_local;
  xr_envelope *this_local;
  
  it._M_current._0_4_ = value;
  it._M_current._4_4_ = time;
  __gnu_cxx::
  __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
  ::__normal_iterator(&local_20);
  bVar1 = std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::empty(&this->m_keys);
  if (bVar1) {
    key_1 = (xr_key *)
            std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::begin(&this->m_keys)
    ;
    local_20._M_current = (xr_key **)key_1;
  }
  else {
    sVar2 = std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::size(&this->m_keys);
    if (sVar2 == 1) {
      ppxVar3 = std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::front
                          (&this->m_keys);
      local_30 = *ppxVar3;
      if (local_30->shape == '\x04') {
        if ((it._M_current._0_4_ == local_30->value) &&
           (!NAN(it._M_current._0_4_) && !NAN(local_30->value))) {
          return;
        }
      }
      if (local_30->time <= it._M_current._4_4_) {
        skey = (xr_key *)
               std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::end
                         (&this->m_keys);
        local_20._M_current = (xr_key **)skey;
      }
      else {
        local_38 = (xr_key **)
                   std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::begin
                             (&this->m_keys);
        local_20._M_current = local_38;
      }
    }
    else {
      ppxVar3 = std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::front
                          (&this->m_keys);
      ekey = *ppxVar3;
      ppxVar3 = std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::back
                          (&this->m_keys);
      local_50 = *ppxVar3;
      if (ekey->time <= it._M_current._4_4_) {
        if (it._M_current._4_4_ <= local_50->time) {
          key1 = (xr_key *)
                 std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::begin
                           (&this->m_keys);
          local_68 = (xr_key **)
                     __gnu_cxx::
                     __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
                     ::operator+((__normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
                                  *)&key1,1);
          local_20 = (__normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
                      )local_68;
          while (ppxVar4 = __gnu_cxx::
                           __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
                           ::operator*(&local_20), (*ppxVar4)->time < it._M_current._4_4_) {
            __gnu_cxx::
            __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
            ::operator++(&local_20);
          }
          ppxVar4 = __gnu_cxx::
                    __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
                    ::operator*(&local_20);
          key0 = *ppxVar4;
          this_00 = __gnu_cxx::
                    __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
                    ::operator--(&local_20);
          ppxVar4 = __gnu_cxx::
                    __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
                    ::operator*(this_00);
          key = *ppxVar4;
          if (key0->shape == '\x04') {
            if ((it._M_current._0_4_ == key->value) &&
               (!NAN(it._M_current._0_4_) && !NAN(key->value))) {
              return;
            }
          }
        }
        else {
          if (local_50->shape == '\x04') {
            if ((it._M_current._0_4_ == local_50->value) &&
               (!NAN(it._M_current._0_4_) && !NAN(local_50->value))) {
              return;
            }
          }
          local_60 = (xr_key **)
                     std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::end
                               (&this->m_keys);
          local_20._M_current = local_60;
        }
      }
      else {
        if (ekey->shape == '\x04') {
          if ((it._M_current._0_4_ == ekey->value) &&
             (!NAN(it._M_current._0_4_) && !NAN(ekey->value))) {
            return;
          }
        }
        local_58 = (xr_key **)
                   std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::begin
                             (&this->m_keys);
        local_20._M_current = local_58;
      }
    }
  }
  this_01 = (xr_key *)operator_new(0x28);
  xr_key::xr_key(this_01);
  this_01->time = it._M_current._4_4_;
  this_01->value = it._M_current._0_4_;
  this_01->shape = '\x04';
  local_88 = this_01;
  __gnu_cxx::
  __normal_iterator<xray_re::xr_key*const*,std::vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>>>
  ::__normal_iterator<xray_re::xr_key**>
            ((__normal_iterator<xray_re::xr_key*const*,std::vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>>>
              *)&local_a0,&local_20);
  std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::insert
            (&this->m_keys,local_a0,&local_88);
  return;
}

Assistant:

void xr_envelope::insert_key(float time, float value)
{
	xr_key_vec_it it;
#if 0
	it = m_keys.end();
#else
	if (m_keys.empty()) {
		it = m_keys.begin();
	} else if (m_keys.size() == 1) {
		xr_key* key = m_keys.front();
		switch (key->shape) {
		case xr_key::SHAPE_STEP:
			if (value == key->value)
				return;
			break;

		default:
			break;
		}
		if (time < key->time)
			it = m_keys.begin();
		else
			it = m_keys.end();
	} else {
		xr_key* skey = m_keys.front();
		xr_key* ekey = m_keys.back();

		if (time < skey->time) {
			switch (skey->shape) {
			case xr_key::SHAPE_STEP:
				if (value == skey->value)
					return;
				break;

			default:
				break;
			}
			it = m_keys.begin();
		} else if (ekey->time < time) {
			switch (ekey->shape) {
			case xr_key::SHAPE_STEP:
				if (value == ekey->value)
					return;
				break;

			default:
				break;
			}
			it = m_keys.end();
		} else {
			for (it = m_keys.begin() + 1; (*it)->time < time; ++it) {}
			xr_key* key1 = *it;
			xr_key* key0 = *--it;
			switch (key1->shape) {
			case xr_key::SHAPE_STEP:
				if (value == key0->value)
					return;
				break;

			default:
				break;
			};
		}
	}
#endif
	xr_key* key = new xr_key;
	key->time = time;
	key->value = value;
	key->shape = xr_key::SHAPE_STEP;
	m_keys.insert(it, key);
}